

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

void aom_denoise_and_model_free(aom_denoise_and_model_t *ctx)

{
  long lVar1;
  
  aom_free(ctx->flat_blocks);
  lVar1 = 5;
  do {
    aom_free(ctx->noise_psd[lVar1 + -2]);
    aom_free(ctx->noise_psd[lVar1 + -5]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  aom_noise_model_free(&ctx->noise_model);
  aom_free((ctx->flat_block_finder).A);
  aom_free((ctx->flat_block_finder).AtA_inv);
  (ctx->flat_block_finder).num_params = 0;
  (ctx->flat_block_finder).block_size = 0;
  (ctx->flat_block_finder).normalization = 0.0;
  (ctx->flat_block_finder).AtA_inv = (double *)0x0;
  (ctx->flat_block_finder).A = (double *)0x0;
  *(undefined8 *)&(ctx->flat_block_finder).use_highbd = 0;
  aom_free(ctx);
  return;
}

Assistant:

void aom_denoise_and_model_free(struct aom_denoise_and_model_t *ctx) {
  aom_free(ctx->flat_blocks);
  for (int i = 0; i < 3; ++i) {
    aom_free(ctx->denoised[i]);
    aom_free(ctx->noise_psd[i]);
  }
  aom_noise_model_free(&ctx->noise_model);
  aom_flat_block_finder_free(&ctx->flat_block_finder);
  aom_free(ctx);
}